

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

Result __thiscall
doctest::detail::Expression_lhs<double_const&>::operator==
          (Expression_lhs<double_const&> *this,double *rhs)

{
  double dVar1;
  double dVar2;
  double *in_RDX;
  EVP_PKEY_CTX *src;
  String extraout_RDX;
  Result RVar3;
  void *local_20;
  
  dVar1 = *(double *)*rhs;
  dVar2 = *in_RDX;
  stringifyBinaryExpr<double,double>((detail *)&local_20,(double *)*rhs," == ",in_RDX);
  *this = (Expression_lhs<double_const&>)(dVar1 == dVar2);
  *(undefined8 *)(this + 8) = 0;
  String::copy((String *)(this + 8),(EVP_PKEY_CTX *)&local_20,src);
  free(local_20);
  RVar3.m_decomposition.m_str = extraout_RDX.m_str;
  RVar3._0_8_ = this;
  return RVar3;
}

Assistant:

Result operator<=(const DOCTEST_REF_WRAP(R) rhs) { return Result(lhs <= rhs, stringifyBinaryExpr(lhs, " <= ", rhs)); }